

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSurfaceTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::resizeSurfaceTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  TestLog *log;
  TestStatus *pTVar1;
  bool bVar2;
  int iVar3;
  qpTestResult qVar4;
  undefined4 extraout_var;
  VkSurfaceCapabilitiesKHR *pVVar5;
  long lVar6;
  Vector<unsigned_int,_2> *value;
  ulong uVar7;
  undefined1 auVar8 [16];
  int iVar9;
  UVec2 testSize;
  VkSurfaceCapabilitiesKHR capabilities;
  UniquePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> nativeWindow;
  UniquePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> nativeDisplay;
  vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> physicalDevices;
  ResultCollector results;
  InstanceHelper instHelper;
  Vector<unsigned_int,_2> local_3a0;
  VkSurfaceCapabilitiesKHR local_398;
  UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> local_360;
  UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> local_350;
  TestStatus *local_340;
  long local_338;
  _Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> local_330;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_318;
  Vector<unsigned_int,_2> local_2f8 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  string local_298;
  undefined1 local_278 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  InstanceHelper local_1e8;
  
  log = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"",(allocator<char> *)&local_398);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_278,log,(string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  InstanceHelper::InstanceHelper(&local_1e8,context,wsiType,(VkAllocationCallbacks *)0x0);
  iVar3 = (*context->m_testCtx->m_platform->_vptr_Platform[5])();
  createDisplay((MovePtr<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)&local_398,
                (Platform *)CONCAT44(extraout_var,iVar3),&local_1e8.supportedExtensions,wsiType);
  local_350.m_data.ptr = (Display *)local_398._0_8_;
  local_398._0_8_ = (Display *)0x0;
  de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~UniqueBase
            ((UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_> *)&local_398);
  local_318.m_data.object.m_internal = 0;
  createWindow((MovePtr<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_398,
               local_350.m_data.ptr,(Maybe<tcu::Vector<unsigned_int,_2>_> *)&local_318);
  local_360.m_data.ptr = (Window *)local_398._0_8_;
  local_398._0_8_ = (Display *)0x0;
  de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~UniqueBase
            ((UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_> *)&local_398);
  ::vk::enumeratePhysicalDevices
            ((vector<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_> *)
             &local_330,&local_1e8.vki.super_InstanceInterface,
             local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object);
  local_340 = __return_storage_ptr__;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&local_398,
             &local_1e8.vki.super_InstanceInterface,
             local_1e8.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             local_350.m_data.ptr,local_360.m_data.ptr,(VkAllocationCallbacks *)0x0);
  local_318.m_data.deleter.m_instance = (VkInstance)local_398.minImageExtent;
  local_318.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_398.maxImageExtent;
  local_318.m_data.object.m_internal._0_4_ = local_398.minImageCount;
  local_318.m_data.object.m_internal._4_4_ = local_398.maxImageCount;
  local_318.m_data.deleter.m_instanceIface = (InstanceInterface *)local_398.currentExtent;
  local_398._0_8_ = (Display *)0x0;
  local_398.currentExtent.width = 0;
  local_398.currentExtent.height = 0;
  local_398.minImageExtent.width = 0;
  local_398.minImageExtent.height = 0;
  local_398.maxImageExtent.width = 0;
  local_398.maxImageExtent.height = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&local_398);
  local_2f8[0].m_data[0] = 0x40;
  local_2f8[0].m_data[1] = 0x40;
  local_2f8[1].m_data[0] = 0x7c;
  local_2f8[1].m_data[1] = 0x77;
  local_2f8[2].m_data[0] = 0x100;
  local_2f8[2].m_data[1] = 0x200;
  lVar6 = 0;
  while (lVar6 != 3) {
    local_338 = lVar6;
    tcu::Vector<unsigned_int,_2>::Vector(&local_3a0,local_2f8 + lVar6);
    (*(local_360.m_data.ptr)->_vptr_Window[2])(local_360.m_data.ptr,&local_3a0);
    for (uVar7 = 0;
        uVar7 < (ulong)((long)local_330._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_330._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar7 = uVar7 + 1) {
      bVar2 = isSupportedByAnyQueue
                        (&local_1e8.vki.super_InstanceInterface,
                         local_330._M_impl.super__Vector_impl_data._M_start[uVar7],
                         (VkSurfaceKHR)local_318.m_data.object.m_internal);
      if (bVar2) {
        pVVar5 = ::vk::wsi::getPhysicalDeviceSurfaceCapabilities
                           (&local_398,&local_1e8.vki.super_InstanceInterface,
                            local_330._M_impl.super__Vector_impl_data._M_start[uVar7],
                            (VkSurfaceKHR)local_318.m_data.object.m_internal);
        iVar3 = -(uint)(local_3a0.m_data[0] == local_398.currentExtent.width);
        iVar9 = -(uint)(local_3a0.m_data[1] == local_398.currentExtent.height);
        auVar8._4_4_ = iVar3;
        auVar8._0_4_ = iVar3;
        auVar8._8_4_ = iVar9;
        auVar8._12_4_ = iVar9;
        iVar3 = movmskpd((int)pVVar5,auVar8);
        de::toString<vk::VkExtent2D>(&local_298,&local_398.currentExtent);
        std::operator+(&local_228,"currentExtent ",&local_298);
        std::operator+(&local_2d8,&local_228," doesn\'t match requested size ");
        de::toString<tcu::Vector<unsigned_int,2>>(&local_2b8,(de *)&local_3a0,value);
        std::operator+(&local_208,&local_2d8,&local_2b8);
        tcu::ResultCollector::check((ResultCollector *)local_278,iVar3 == 3,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::string::~string((string *)&local_298);
      }
    }
    lVar6 = local_338 + 1;
  }
  qVar4 = tcu::ResultCollector::getResult((ResultCollector *)local_278);
  std::__cxx11::string::string((string *)&local_398,(string *)(local_278 + 0x30));
  pTVar1 = local_340;
  local_340->m_code = qVar4;
  std::__cxx11::string::string((string *)&local_340->m_description,(string *)&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_318);
  std::_Vector_base<vk::VkPhysicalDevice_s_*,_std::allocator<vk::VkPhysicalDevice_s_*>_>::
  ~_Vector_base(&local_330);
  de::details::UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>::~UniqueBase
            (&local_360);
  de::details::UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>::~UniqueBase
            (&local_350);
  InstanceHelper::~InstanceHelper(&local_1e8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_278);
  return pTVar1;
}

Assistant:

tcu::TestStatus resizeSurfaceTest (Context& context, Type wsiType)
{
	tcu::TestLog&					log				= context.getTestContext().getLog();
	tcu::ResultCollector			results			(log);

	const InstanceHelper			instHelper		(context, wsiType);

	const UniquePtr<Display>		nativeDisplay	(createDisplay(context.getTestContext().getPlatform().getVulkanPlatform(),
																   instHelper.supportedExtensions,
																   wsiType));
	UniquePtr<Window>				nativeWindow	(createWindow(*nativeDisplay, tcu::nothing<UVec2>()));

	const vector<VkPhysicalDevice>	physicalDevices	= enumeratePhysicalDevices(instHelper.vki, *instHelper.instance);
	const Unique<VkSurfaceKHR>		surface			(createSurface(instHelper.vki, *instHelper.instance, wsiType, *nativeDisplay, *nativeWindow));

	const UVec2						sizes[]			=
	{
		UVec2(64, 64),
		UVec2(124, 119),
		UVec2(256, 512)
	};

	DE_ASSERT(getPlatformProperties(wsiType).features & PlatformProperties::FEATURE_RESIZE_WINDOW);

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); ++sizeNdx)
	{
		const UVec2		testSize	= sizes[sizeNdx];

		try
		{
			nativeWindow->resize(testSize);
		}
		catch (const tcu::Exception& e)
		{
			// Make sure all exception types result in a test failure
			results.fail(e.getMessage());
		}

		for (size_t deviceNdx = 0; deviceNdx < physicalDevices.size(); ++deviceNdx)
		{
			if (isSupportedByAnyQueue(instHelper.vki, physicalDevices[deviceNdx], *surface))
			{
				const VkSurfaceCapabilitiesKHR	capabilities	= getPhysicalDeviceSurfaceCapabilities(instHelper.vki, physicalDevices[deviceNdx], *surface);

				// \note Assumes that surface size is NOT set by swapchain if initial window size is honored by platform
				results.check(capabilities.currentExtent.width == testSize.x() &&
								capabilities.currentExtent.height == testSize.y(),
								"currentExtent " + de::toString(capabilities.currentExtent) + " doesn't match requested size " + de::toString(testSize));
			}
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}